

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# OPC_TreeCollider.cpp
# Opt level: O2

bool __thiscall Opcode::AABBTreeCollider::CheckTemporalCoherence(AABBTreeCollider *this,Pair *cache)

{
  if (cache == (Pair *)0x0) {
    return false;
  }
  if (((~(this->super_Collider).mFlags & 3) == 0) &&
     (PrimTest(this,cache->id0,cache->id1), ((this->super_Collider).mFlags & 4) != 0)) {
    return true;
  }
  return false;
}

Assistant:

bool AABBTreeCollider::CheckTemporalCoherence(Pair* cache)
{
	// Checkings
	if(!cache)	return false;

	// Test previously colliding primitives first
	if(TemporalCoherenceEnabled() && FirstContactEnabled())
	{
		PrimTest(cache->id0, cache->id1);
		if(GetContactStatus())	return true;
	}
	return false;
}